

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addMemory
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,MemType type,
          Index pos)

{
  Module *wasm;
  Err *pEVar1;
  Memory **ppMVar2;
  size_type sVar3;
  bool bVar4;
  Ok local_1d9;
  value_type local_1d8;
  Err local_1a8;
  Err *local_188;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Memory_*> _val_1;
  undefined1 local_c8 [8];
  Result<wasm::Memory_*> m;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  ImportNames *import_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = import;
  checkImport((Result<wasm::Ok> *)&err,this,pos,import);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_1_ = local_68 != (Err *)0x0;
  if ((bool)m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_4_ == 0) {
    _val_1.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._32_8_ = type.addressType.id;
    addMemoryDecl((Result<wasm::Memory_*> *)local_c8,this,pos,name,
                  (ImportNames *)
                  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,type);
    Result<wasm::Memory_*>::Result
              ((Result<wasm::Memory_*> *)&err_1,(Result<wasm::Memory_*> *)local_c8);
    pEVar1 = Result<wasm::Memory_*>::getErr((Result<wasm::Memory_*> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index,pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index);
      wasm::Err::~Err((Err *)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index);
    }
    m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._37_3_ = 0;
    m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Memory_*>::~Result((Result<wasm::Memory_*> *)&err_1);
    if (m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_4_ == 0) {
      wasm = this->wasm;
      ppMVar2 = Result<wasm::Memory_*>::operator*((Result<wasm::Memory_*> *)local_c8);
      anon_unknown_5::addExports
                ((Result<wasm::Ok> *)&err_2,&this->in,wasm,(Named *)*ppMVar2,exports,Memory);
      local_188 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar4 = local_188 != (Err *)0x0;
      if (bVar4) {
        wasm::Err::Err(&local_1a8,local_188);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1a8);
        wasm::Err::~Err(&local_1a8);
      }
      m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._37_3_ = 0;
      m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_1_ = bVar4;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_4_ == 0) {
        local_1d8.pos = pos;
        local_1d8.name.super_IString.str._M_len = name.super_IString.str._M_len;
        local_1d8.name.super_IString.str._M_str = name.super_IString.str._M_str;
        sVar3 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                          (&this->memoryDefs);
        local_1d8.index = (Index)sVar3;
        local_1d8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector(&local_1d8.annotations);
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
                  (&this->memoryDefs,&local_1d8);
        DefPos::~DefPos(&local_1d8);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1d9);
        m.val.super__Variant_base<wasm::Memory_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Memory_*,_wasm::Err>._36_4_ = 1;
      }
    }
    Result<wasm::Memory_*>::~Result((Result<wasm::Memory_*> *)local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addMemory(Name name,
                                  const std::vector<Name>& exports,
                                  ImportNames* import,
                                  MemType type,
                                  Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto m = addMemoryDecl(pos, name, import, type);
  CHECK_ERR(m);
  CHECK_ERR(addExports(in, wasm, *m, exports, ExternalKind::Memory));
  // TODO: memory annotations
  memoryDefs.push_back({name, pos, Index(memoryDefs.size()), {}});
  return Ok{};
}